

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

bool __thiscall cmFindBase::Validate(cmFindBase *this,string *path)

{
  allocator<cmListFileArgument> *this_00;
  cmMakefile *this_01;
  initializer_list<cmListFileArgument> __l;
  bool bVar1;
  ulong uVar2;
  static_string_view sVar3;
  cmListFileArgument *local_2e0;
  cmValue local_298;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  undefined1 local_268 [8];
  cmExecutionStatus status;
  string local_218;
  string local_1f8;
  cmListFileArgument *local_1d8;
  cmListFileArgument local_1d0;
  cmListFileArgument local_1a0;
  iterator local_170;
  size_type local_168;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_160;
  string local_148;
  undefined1 local_128 [8];
  cmListFileFunction validator;
  string local_108;
  cmAlphaNum local_e8;
  string_view local_b8;
  string_view local_a8;
  cmAlphaNum local_90;
  undefined1 local_60 [8];
  string resultName;
  PolicyPushPop local_30;
  PolicyPushPop polScope;
  ScopePushPop varScope;
  string *path_local;
  cmFindBase *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmMakefile::ScopePushPop::ScopePushPop
              ((ScopePushPop *)&polScope,(this->super_cmFindCommon).Makefile);
    cmMakefile::PolicyPushPop::PolicyPushPop(&local_30,(this->super_cmFindCommon).Makefile);
    local_b8 = (string_view)::cm::operator____s("CMAKE_",6);
    local_a8 = local_b8;
    cmAlphaNum::cmAlphaNum(&local_90,local_b8);
    cmsys::SystemTools::UpperCase(&local_108,&this->FindCommandName);
    cmAlphaNum::cmAlphaNum(&local_e8,&local_108);
    sVar3 = ::cm::operator____s("_VALIDATOR_STATUS",0x11);
    validator.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3.super_string_view._M_len;
    cmStrCat<cm::static_string_view>
              ((string *)local_60,&local_90,&local_e8,
               (static_string_view *)
               &validator.Impl.
                super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&local_108);
    cmMakefile::AddDefinitionBool((this->super_cmFindCommon).Makefile,(string *)local_60,true);
    std::__cxx11::string::string((string *)&local_148,(string *)&this->ValidatorName);
    status.Variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    local_1d8 = &local_1d0;
    std::__cxx11::string::string((string *)&local_1f8,(string *)local_60);
    cmListFileArgument::cmListFileArgument(&local_1d0,&local_1f8,Unquoted,0);
    local_1d8 = &local_1a0;
    std::__cxx11::string::string((string *)&local_218,(string *)path);
    cmListFileArgument::cmListFileArgument(&local_1a0,&local_218,Quoted,0);
    status.Variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    local_170 = &local_1d0;
    local_168 = 2;
    this_00 = (allocator<cmListFileArgument> *)
              ((long)&status.Variables.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
    std::allocator<cmListFileArgument>::allocator(this_00);
    __l._M_len = local_168;
    __l._M_array = local_170;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
              (&local_160,__l,this_00);
    cmListFileFunction::cmListFileFunction
              ((cmListFileFunction *)local_128,&local_148,0,0,&local_160);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_160);
    std::allocator<cmListFileArgument>::~allocator
              ((allocator<cmListFileArgument> *)
               ((long)&status.Variables.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    local_2e0 = (cmListFileArgument *)&local_170;
    do {
      local_2e0 = local_2e0 + -1;
      cmListFileArgument::~cmListFileArgument(local_2e0);
    } while (local_2e0 != &local_1d0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_148);
    cmExecutionStatus::cmExecutionStatus
              ((cmExecutionStatus *)local_268,(this->super_cmFindCommon).Makefile);
    this_01 = (this->super_cmFindCommon).Makefile;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_290);
    bVar1 = cmMakefile::ExecuteCommand
                      (this_01,(cmListFileFunction *)local_128,(cmExecutionStatus *)local_268,
                       &local_290);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_290);
    if (bVar1) {
      local_298 = cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,(string *)local_60);
      this_local._7_1_ = cmValue::IsOn(&local_298);
    }
    else {
      this_local._7_1_ = false;
    }
    cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_268);
    cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_128);
    std::__cxx11::string::~string((string *)local_60);
    cmMakefile::PolicyPushPop::~PolicyPushPop(&local_30);
    cmMakefile::ScopePushPop::~ScopePushPop((ScopePushPop *)&polScope);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFindBase::Validate(const std::string& path) const
{
  if (this->ValidatorName.empty()) {
    return true;
  }

  // The validator command will be executed in an isolated scope.
  cmMakefile::ScopePushPop varScope(this->Makefile);
  cmMakefile::PolicyPushPop polScope(this->Makefile);
  static_cast<void>(varScope);
  static_cast<void>(polScope);

  auto resultName =
    cmStrCat("CMAKE_"_s, cmSystemTools::UpperCase(this->FindCommandName),
             "_VALIDATOR_STATUS"_s);

  this->Makefile->AddDefinitionBool(resultName, true);

  cmListFileFunction validator(
    this->ValidatorName, 0, 0,
    { cmListFileArgument(resultName, cmListFileArgument::Unquoted, 0),
      cmListFileArgument(path, cmListFileArgument::Quoted, 0) });
  cmExecutionStatus status(*this->Makefile);

  if (this->Makefile->ExecuteCommand(validator, status)) {
    return this->Makefile->GetDefinition(resultName).IsOn();
  }
  return false;
}